

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_service_multiface(t_cpp_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  uint uVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_service *ptVar3;
  ostream *poVar4;
  ulong uVar5;
  reference pptVar6;
  t_struct *this_00;
  members_type *this_01;
  string *psVar7;
  t_type *ptVar8;
  reference pptVar9;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  allocator local_489;
  string local_488;
  allocator local_461;
  string local_460;
  string local_440;
  string local_420;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_400
  ;
  t_field **local_3f8;
  byte local_3ea;
  allocator local_3e9;
  undefined1 local_3e8 [6];
  bool first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  string call;
  const_iterator a_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *args;
  t_struct *arglist;
  t_function **local_368;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  string local_180;
  allocator local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string list_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  allocator local_91;
  string local_90 [8];
  string extends_multiface;
  allocator local_59;
  undefined1 local_58 [8];
  string extends;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)((long)&extends.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ptVar3 = t_service::get_extends(tservice);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends(tservice);
    type_name_abi_cxx11_(&local_b8,this,&ptVar3->super_t_type,false,false);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&list_type.field_2 + 8),", public ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&list_type.field_2 + 8),"Multiface");
    std::__cxx11::string::operator=(local_90,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)(list_type.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"std::vector<std::shared_ptr<",&local_159);
  std::operator+(&local_138,&local_158,
                 &(this->super_t_oop_generator).super_t_generator.service_name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 &local_138,"If> >");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  poVar4 = std::operator<<((ostream *)&this->f_header_,"class ");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"Multiface : ");
  poVar4 = std::operator<<(poVar4,"virtual public ");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"If");
  poVar4 = std::operator<<(poVar4,local_90);
  poVar4 = std::operator<<(poVar4," {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"Multiface(");
  poVar4 = std::operator<<(poVar4,(string *)local_118);
  poVar4 = std::operator<<(poVar4,"& ifaces) : ifaces_(ifaces) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_1a0);
    std::operator+(&local_1e0,"  std::vector<std::shared_ptr<",
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+(&local_1c0,&local_1e0,"If> >::iterator iter;");
    poVar4 = std::operator<<(poVar4,(string *)&local_1c0);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_200);
    poVar4 = std::operator<<(poVar4,"  for (iter = ifaces.begin(); iter != ifaces.end(); ++iter) {")
    ;
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_220);
    poVar4 = std::operator<<(poVar4,"    ");
    poVar4 = std::operator<<(poVar4,(string *)local_58);
    poVar4 = std::operator<<(poVar4,"Multiface::add(*iter);");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_240);
    poVar4 = std::operator<<(poVar4,"  }");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  t_generator::indent_abi_cxx11_(&local_260,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_260);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_280);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"Multiface() {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  t_generator::indent_down((t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_," protected:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_2a0);
  poVar4 = std::operator<<(poVar4,(string *)local_118);
  poVar4 = std::operator<<(poVar4," ifaces_;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_2c0);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"Multiface() {}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_2e0);
  poVar4 = std::operator<<(poVar4,"void add(::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"If> iface) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_300,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_300);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)local_58);
    poVar4 = std::operator<<(poVar4,"Multiface::add(iface);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_300);
  }
  t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_320);
  poVar4 = std::operator<<(poVar4,"  ifaces_.push_back(iface);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_340);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_360);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_360);
  t_generator::indent_up((t_generator *)this);
  local_368 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  extends.field_2._8_8_ = local_368;
  while( true ) {
    arglist = (t_struct *)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&arglist);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,&this->f_header_,*pptVar6);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    this_00 = t_function::get_arglist(*pptVar6);
    this_01 = t_struct::get_members(this_00);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)((long)&call.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_3e8,"ifaces_[i]->",&local_3e9);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::operator+(&local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                   psVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                   &local_3c8,"(");
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    local_3ea = 1;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    ptVar8 = t_function::get_returntype(*pptVar6);
    bVar1 = is_complex_type(this,ptVar8);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)local_3a8,"_return");
      local_3ea = 0;
    }
    local_3f8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_01);
    call.field_2._8_8_ = local_3f8;
    while( true ) {
      local_400._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_01);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&call.field_2 + 8),&local_400);
      if (!bVar1) break;
      if ((local_3ea & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_3a8,", ");
      }
      else {
        local_3ea = 0;
      }
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&call.field_2 + 8));
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
      std::__cxx11::string::operator+=((string *)local_3a8,(string *)psVar7);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&call.field_2 + 8));
    }
    std::__cxx11::string::operator+=((string *)local_3a8,")");
    t_generator::indent_abi_cxx11_(&local_420,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_420);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    tfunction = *pptVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_460,"",&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_488,"",&local_489);
    function_signature(&local_440,this,tfunction,&local_460,&local_488,true);
    poVar4 = std::operator<<(poVar4,(string *)&local_440);
    poVar4 = std::operator<<(poVar4," override {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    std::__cxx11::string::~string((string *)&local_420);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_4b0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_4b0);
    poVar4 = std::operator<<(poVar4,"size_t sz = ifaces_.size();");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_4d0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_4d0);
    poVar4 = std::operator<<(poVar4,"size_t i = 0;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_4f0);
    poVar4 = std::operator<<(poVar4,"for (; i < (sz - 1); ++i) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_510);
    poVar4 = std::operator<<(poVar4,(string *)local_3a8);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_510);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_530);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_530);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    ptVar8 = t_function::get_returntype(*pptVar6);
    uVar2 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&extends.field_2 + 8));
      ptVar8 = t_function::get_returntype(*pptVar6);
      bVar1 = is_complex_type(this,ptVar8);
      if (bVar1) {
        t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_550);
        poVar4 = std::operator<<(poVar4,(string *)local_3a8);
        poVar4 = std::operator<<(poVar4,";");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_570,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_570);
        poVar4 = std::operator<<(poVar4,"return;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_550);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_590,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_590);
        poVar4 = std::operator<<(poVar4,"return ");
        poVar4 = std::operator<<(poVar4,(string *)local_3a8);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_590);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_5b0);
      poVar4 = std::operator<<(poVar4,(string *)local_3a8);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5b0);
    }
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_5d0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_5d0);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)local_3a8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_header_,(string *)&local_5f0);
  poVar4 = std::operator<<(poVar4,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_cpp_generator::generate_service_multiface(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_multiface = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_multiface = ", public " + extends + "Multiface";
  }

  string list_type = string("std::vector<std::shared_ptr<") + service_name_ + "If> >";

  // Generate the header portion
  f_header_ << "class " << service_name_ << "Multiface : "
            << "virtual public " << service_name_ << "If" << extends_multiface << " {" << endl
            << " public:" << endl;
  indent_up();
  f_header_ << indent() << service_name_ << "Multiface(" << list_type
            << "& ifaces) : ifaces_(ifaces) {" << endl;
  if (!extends.empty()) {
    f_header_ << indent()
              << "  std::vector<std::shared_ptr<" + service_name_ + "If> >::iterator iter;"
              << endl << indent() << "  for (iter = ifaces.begin(); iter != ifaces.end(); ++iter) {"
              << endl << indent() << "    " << extends << "Multiface::add(*iter);" << endl
              << indent() << "  }" << endl;
  }
  f_header_ << indent() << "}" << endl << indent() << "virtual ~" << service_name_
            << "Multiface() {}" << endl;
  indent_down();

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << list_type << " ifaces_;" << endl << indent() << service_name_
            << "Multiface() {}" << endl << indent() << "void add(::std::shared_ptr<"
            << service_name_ << "If> iface) {" << endl;
  if (!extends.empty()) {
    f_header_ << indent() << "  " << extends << "Multiface::add(iface);" << endl;
  }
  f_header_ << indent() << "  ifaces_.push_back(iface);" << endl << indent() << "}" << endl;
  indent_down();

  f_header_ << indent() << " public:" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_header_, *f_iter);
    t_struct* arglist = (*f_iter)->get_arglist();
    const vector<t_field*>& args = arglist->get_members();
    vector<t_field*>::const_iterator a_iter;

    string call = string("ifaces_[i]->") + (*f_iter)->get_name() + "(";
    bool first = true;
    if (is_complex_type((*f_iter)->get_returntype())) {
      call += "_return";
      first = false;
    }
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      if (first) {
        first = false;
      } else {
        call += ", ";
      }
      call += (*a_iter)->get_name();
    }
    call += ")";

    f_header_ << indent() << function_signature(*f_iter, "") << " override {" << endl;
    indent_up();
    f_header_ << indent() << "size_t sz = ifaces_.size();" << endl << indent() << "size_t i = 0;"
              << endl << indent() << "for (; i < (sz - 1); ++i) {" << endl;
    indent_up();
    f_header_ << indent() << call << ";" << endl;
    indent_down();
    f_header_ << indent() << "}" << endl;

    if (!(*f_iter)->get_returntype()->is_void()) {
      if (is_complex_type((*f_iter)->get_returntype())) {
        f_header_ << indent() << call << ";" << endl << indent() << "return;" << endl;
      } else {
        f_header_ << indent() << "return " << call << ";" << endl;
      }
    } else {
      f_header_ << indent() << call << ";" << endl;
    }

    indent_down();
    f_header_ << indent() << "}" << endl << endl;
  }

  indent_down();
  f_header_ << indent() << "};" << endl << endl;
}